

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InputScalarN(char *label,ImGuiDataType data_type,void *v,int components,void *step,
                        void *step_fast,char *format,ImGuiInputTextFlags flags)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  int in_ECX;
  char *in_RDI;
  int i;
  size_t type_size;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_00000050;
  undefined4 in_stack_00000060;
  ImGuiDataType in_stack_00000074;
  char *in_stack_00000078;
  ImGuiInputTextFlags in_stack_00000090;
  char *in_stack_000000a8;
  char *in_stack_000000b0;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int int_id;
  bool local_1;
  
  pIVar2 = GetCurrentWindow();
  if ((pIVar2->SkipItems & 1U) == 0) {
    local_1 = false;
    BeginGroup();
    PushID((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    PushMultiItemsWidths(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    for (int_id = 0; int_id < in_ECX; int_id = int_id + 1) {
      PushID(int_id);
      bVar1 = InputScalar(in_stack_00000078,in_stack_00000074,label,
                          (void *)CONCAT44(data_type,in_stack_00000060),v,
                          (char *)CONCAT44(components,in_stack_00000050),in_stack_00000090);
      local_1 = local_1 != false || bVar1;
      SameLine(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      PopID();
      PopItemWidth();
    }
    PopID();
    FindRenderedTextEnd(in_RDI,(char *)0x0);
    TextUnformatted(in_stack_000000b0,in_stack_000000a8);
    EndGroup();
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::InputScalarN(const char* label, ImGuiDataType data_type, void* v, int components, const void* step, const void* step_fast, const char* format, ImGuiInputTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= InputScalar("##v", data_type, v, step, step_fast, format, flags);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
        v = (void*)((char*)v + type_size);
    }
    PopID();

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();
    return value_changed;
}